

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void md5_ez(char *hash,char *msg,size_t len)

{
  undefined1 *in_RDI;
  int i;
  md5_byte_t digest [16];
  md5_state_t s;
  uchar in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff70;
  int iVar1;
  md5_byte_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  md5_byte_t *in_stack_ffffffffffffff88;
  md5_word_t in_stack_ffffffffffffff90 [2];
  undefined1 *local_8;
  
  md5_init((md5_state_t *)&stack0xffffffffffffff90);
  md5_append((md5_state_t *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff84);
  md5_finish((md5_state_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  local_8 = in_RDI;
  for (iVar1 = 0; iVar1 < 0x10; iVar1 = iVar1 + 1) {
    byte_to_xdigits((char *)CONCAT44(iVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6f);
    local_8 = local_8 + 2;
  }
  *local_8 = 0;
  return;
}

Assistant:

void md5_ez(char *hash, const char *msg, size_t len)
{
    md5_state_t s;
    md5_byte_t digest[16];

    /* calculate the binary md5 of the message */
    md5_init(&s);
    md5_append(&s, (const md5_byte_t *)msg, len);
    md5_finish(&s, digest);

    /* convert the binary hash to printable hex digits */
    for (int i = 0 ; i < 16 ; ++i, hash += 2)
        byte_to_xdigits(hash, digest[i]);

    /* null-terminate the output string */
    *hash = '\0';
}